

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void resched_stream_data(quicly_stream_t *stream)

{
  ulong uVar1;
  st_quicly_stream_scheduler_t *psVar2;
  byte bVar3;
  byte bVar4;
  
  uVar1 = stream->stream_id;
  if ((long)uVar1 < 0) {
    if (uVar1 < 0xfffffffffffffffc) {
      __assert_fail("-4 <= stream->stream_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x341,"void resched_stream_data(quicly_stream_t *)");
    }
    bVar4 = (stream->conn->egress).pending_flows;
    bVar3 = (byte)(1 << (~(byte)uVar1 & 0x1f));
    if ((stream->sendstate).pending.num_ranges == 0) {
      bVar4 = bVar4 & ~bVar3;
    }
    else {
      bVar4 = bVar4 | bVar3;
    }
    (stream->conn->egress).pending_flows = bVar4;
  }
  else if ((stream->field_0xb8 & 1) == 0) {
    psVar2 = ((stream->conn->super).ctx)->stream_scheduler;
    (*psVar2->update_state)(psVar2,stream);
    return;
  }
  return;
}

Assistant:

static void resched_stream_data(quicly_stream_t *stream)
{
    if (stream->stream_id < 0) {
        assert(-4 <= stream->stream_id);
        uint8_t mask = 1 << -(1 + stream->stream_id);
        if (stream->sendstate.pending.num_ranges != 0) {
            stream->conn->egress.pending_flows |= mask;
        } else {
            stream->conn->egress.pending_flows &= ~mask;
        }
        return;
    }

    /* do nothing if blocked */
    if (stream->streams_blocked)
        return;

    quicly_stream_scheduler_t *scheduler = stream->conn->super.ctx->stream_scheduler;
    scheduler->update_state(scheduler, stream);
}